

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

bool __thiscall duckdb::DataTable::HasUniqueIndexes(DataTable *this)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  DataTableInfo *pDVar4;
  type pIVar5;
  pointer this_00;
  
  pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  bVar2 = TableIndexList::Empty(&pDVar4->indexes);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&pDVar4->indexes);
    if (iVar3 != 0) {
      ::std::__throw_system_error(iVar3);
    }
    this_00 = (pDVar4->indexes).indexes.
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pDVar4->indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 == puVar1) {
      bVar2 = false;
    }
    else {
      do {
        pIVar5 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                           (this_00);
        iVar3 = (*pIVar5->_vptr_Index[5])(pIVar5);
        bVar2 = (byte)((char)iVar3 - 1U) < 2;
        if (bVar2) break;
        this_00 = this_00 + 1;
      } while (this_00 != puVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pDVar4->indexes);
  }
  return bVar2;
}

Assistant:

bool DataTable::HasUniqueIndexes() const {
	if (!HasIndexes()) {
		return false;
	}
	bool has_unique_index = false;
	info->indexes.Scan([&](Index &index) {
		if (index.IsUnique()) {
			has_unique_index = true;
			return true;
		}
		return false;
	});
	return has_unique_index;
}